

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImgDisplay * __thiscall
cimg_library::CImgDisplay::set_key(CImgDisplay *this,uint keycode,bool pressed)

{
  switch(keycode) {
  case 0x20:
    this->_is_keySPACE = pressed;
    break;
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
    break;
  case 0x30:
    this->_is_key0 = pressed;
    break;
  case 0x31:
    this->_is_key1 = pressed;
    break;
  case 0x32:
    this->_is_key2 = pressed;
    break;
  case 0x33:
    this->_is_key3 = pressed;
    break;
  case 0x34:
    this->_is_key4 = pressed;
    break;
  case 0x35:
    this->_is_key5 = pressed;
    break;
  case 0x36:
    this->_is_key6 = pressed;
    break;
  case 0x37:
    this->_is_key7 = pressed;
    break;
  case 0x38:
    this->_is_key8 = pressed;
    break;
  case 0x39:
    this->_is_key9 = pressed;
    break;
  case 0x61:
    this->_is_keyA = pressed;
    break;
  case 0x62:
    this->_is_keyB = pressed;
    break;
  case 99:
    this->_is_keyC = pressed;
    break;
  case 100:
    this->_is_keyD = pressed;
    break;
  case 0x65:
    this->_is_keyE = pressed;
    break;
  case 0x66:
    this->_is_keyF = pressed;
    break;
  case 0x67:
    this->_is_keyG = pressed;
    break;
  case 0x68:
    this->_is_keyH = pressed;
    break;
  case 0x69:
    this->_is_keyI = pressed;
    break;
  case 0x6a:
    this->_is_keyJ = pressed;
    break;
  case 0x6b:
    this->_is_keyK = pressed;
    break;
  case 0x6c:
    this->_is_keyL = pressed;
    break;
  case 0x6d:
    this->_is_keyM = pressed;
    break;
  case 0x6e:
    this->_is_keyN = pressed;
    break;
  case 0x6f:
    this->_is_keyO = pressed;
    break;
  case 0x70:
    this->_is_keyP = pressed;
    break;
  case 0x71:
    this->_is_keyQ = pressed;
    break;
  case 0x72:
    this->_is_keyR = pressed;
    break;
  case 0x73:
    this->_is_keyS = pressed;
    break;
  case 0x74:
    this->_is_keyT = pressed;
    break;
  case 0x75:
    this->_is_keyU = pressed;
    break;
  case 0x76:
    this->_is_keyV = pressed;
    break;
  case 0x77:
    this->_is_keyW = pressed;
    break;
  case 0x78:
    this->_is_keyX = pressed;
    break;
  case 0x79:
    this->_is_keyY = pressed;
    break;
  case 0x7a:
    this->_is_keyZ = pressed;
    break;
  default:
    switch(keycode) {
    case 0xffaa:
      this->_is_keyPADMUL = pressed;
      break;
    case 0xffab:
      this->_is_keyPADADD = pressed;
      break;
    case 0xffac:
    case 0xffae:
    case 0xffba:
    case 0xffbb:
    case 0xffbc:
    case 0xffbd:
    case 0xffca:
    case 0xffcb:
    case 0xffcc:
    case 0xffcd:
    case 0xffce:
    case 0xffcf:
    case 0xffd0:
    case 0xffd1:
    case 0xffd2:
    case 0xffd3:
    case 0xffd4:
    case 0xffd5:
    case 0xffd6:
    case 0xffd7:
    case 0xffd8:
    case 0xffd9:
    case 0xffda:
    case 0xffdb:
    case 0xffdc:
    case 0xffdd:
    case 0xffde:
    case 0xffdf:
    case 0xffe0:
    case 0xffe6:
    case 0xffe7:
    case 0xffe8:
    case 0xffed:
    case 0xffee:
    case 0xffef:
    case 0xfff0:
    case 0xfff1:
    case 0xfff2:
    case 0xfff3:
    case 0xfff4:
    case 0xfff5:
    case 0xfff6:
    case 0xfff7:
    case 0xfff8:
    case 0xfff9:
    case 0xfffa:
    case 0xfffb:
    case 0xfffc:
    case 0xfffd:
    case 0xfffe:
      break;
    case 0xffad:
      this->_is_keyPADSUB = pressed;
      break;
    case 0xffaf:
      this->_is_keyPADDIV = pressed;
      break;
    case 0xffb0:
      this->_is_keyPAD0 = pressed;
      break;
    case 0xffb1:
      this->_is_keyPAD1 = pressed;
      break;
    case 0xffb2:
      this->_is_keyPAD2 = pressed;
      break;
    case 0xffb3:
      this->_is_keyPAD3 = pressed;
      break;
    case 0xffb4:
      this->_is_keyPAD4 = pressed;
      break;
    case 0xffb5:
      this->_is_keyPAD5 = pressed;
      break;
    case 0xffb6:
      this->_is_keyPAD6 = pressed;
      break;
    case 0xffb7:
      this->_is_keyPAD7 = pressed;
      break;
    case 0xffb8:
      this->_is_keyPAD8 = pressed;
      break;
    case 0xffb9:
      this->_is_keyPAD9 = pressed;
      break;
    case 0xffbe:
      this->_is_keyF1 = pressed;
      break;
    case 0xffbf:
      this->_is_keyF2 = pressed;
      break;
    case 0xffc0:
      this->_is_keyF3 = pressed;
      break;
    case 0xffc1:
      this->_is_keyF4 = pressed;
      break;
    case 0xffc2:
      this->_is_keyF5 = pressed;
      break;
    case 0xffc3:
      this->_is_keyF6 = pressed;
      break;
    case 0xffc4:
      this->_is_keyF7 = pressed;
      break;
    case 0xffc5:
      this->_is_keyF8 = pressed;
      break;
    case 0xffc6:
      this->_is_keyF9 = pressed;
      break;
    case 0xffc7:
      this->_is_keyF10 = pressed;
      break;
    case 0xffc8:
      this->_is_keyF11 = pressed;
      break;
    case 0xffc9:
      this->_is_keyF12 = pressed;
      break;
    case 0xffe1:
      this->_is_keySHIFTLEFT = pressed;
      break;
    case 0xffe2:
      this->_is_keySHIFTRIGHT = pressed;
      break;
    case 0xffe3:
      this->_is_keyCTRLLEFT = pressed;
      break;
    case 0xffe4:
      this->_is_keyCTRLRIGHT = pressed;
      break;
    case 0xffe5:
      this->_is_keyCAPSLOCK = pressed;
      break;
    case 0xffe9:
      this->_is_keyALT = pressed;
      break;
    case 0xffea:
      this->_is_keyALTGR = pressed;
      break;
    case 0xffeb:
      this->_is_keyAPPLEFT = pressed;
      break;
    case 0xffec:
      this->_is_keyAPPRIGHT = pressed;
      break;
    case 0xffff:
      this->_is_keyDELETE = pressed;
      break;
    default:
      switch(keycode) {
      case 0xff50:
        this->_is_keyHOME = pressed;
        break;
      case 0xff51:
        this->_is_keyARROWLEFT = pressed;
        break;
      case 0xff52:
        this->_is_keyARROWUP = pressed;
        break;
      case 0xff53:
        this->_is_keyARROWRIGHT = pressed;
        break;
      case 0xff54:
        this->_is_keyARROWDOWN = pressed;
        break;
      case 0xff55:
        this->_is_keyPAGEUP = pressed;
        break;
      case 0xff56:
        this->_is_keyPAGEDOWN = pressed;
        break;
      case 0xff57:
        this->_is_keyEND = pressed;
        break;
      case 0xff58:
      case 0xff59:
      case 0xff5a:
      case 0xff5b:
      case 0xff5c:
      case 0xff5d:
      case 0xff5e:
      case 0xff5f:
      case 0xff60:
      case 0xff61:
      case 0xff62:
      case 0xff64:
      case 0xff65:
      case 0xff66:
        break;
      case 0xff63:
        this->_is_keyINSERT = pressed;
        break;
      case 0xff67:
        this->_is_keyMENU = pressed;
        break;
      default:
        if (keycode == 0xff08) {
          this->_is_keyBACKSPACE = pressed;
        }
        else if (keycode == 0xff09) {
          this->_is_keyTAB = pressed;
        }
        else if (keycode == 0xff0d) {
          this->_is_keyENTER = pressed;
        }
        else if (keycode == 0xff13) {
          this->_is_keyPAUSE = pressed;
        }
        else if (keycode == 0xff1b) {
          this->_is_keyESC = pressed;
        }
      }
    }
  }
  if (pressed) {
    if (this->_keys[0] != 0) {
      memmove(this->_keys + 1,this->_keys,0x1fc);
    }
    this->_keys[0] = keycode;
    if (this->_released_keys[0] != 0) {
      memmove(this->_released_keys + 1,this->_released_keys,0x1fc);
      this->_released_keys[0] = 0;
    }
  }
  else {
    if (this->_keys[0] != 0) {
      memmove(this->_keys + 1,this->_keys,0x1fc);
      this->_keys[0] = 0;
    }
    if (this->_released_keys[0] != 0) {
      memmove(this->_released_keys + 1,this->_released_keys,0x1fc);
    }
    this->_released_keys[0] = keycode;
  }
  this->_is_event = keycode != 0;
  return this;
}

Assistant:

CImgDisplay& set_key(const unsigned int keycode, const bool pressed=true) {
#define _cimg_set_key(k) if (keycode==cimg::key##k) _is_key##k = pressed;
      _cimg_set_key(ESC); _cimg_set_key(F1); _cimg_set_key(F2); _cimg_set_key(F3);
      _cimg_set_key(F4); _cimg_set_key(F5); _cimg_set_key(F6); _cimg_set_key(F7);
      _cimg_set_key(F8); _cimg_set_key(F9); _cimg_set_key(F10); _cimg_set_key(F11);
      _cimg_set_key(F12); _cimg_set_key(PAUSE); _cimg_set_key(1); _cimg_set_key(2);
      _cimg_set_key(3); _cimg_set_key(4); _cimg_set_key(5); _cimg_set_key(6);
      _cimg_set_key(7); _cimg_set_key(8); _cimg_set_key(9); _cimg_set_key(0);
      _cimg_set_key(BACKSPACE); _cimg_set_key(INSERT); _cimg_set_key(HOME);
      _cimg_set_key(PAGEUP); _cimg_set_key(TAB); _cimg_set_key(Q); _cimg_set_key(W);
      _cimg_set_key(E); _cimg_set_key(R); _cimg_set_key(T); _cimg_set_key(Y);
      _cimg_set_key(U); _cimg_set_key(I); _cimg_set_key(O); _cimg_set_key(P);
      _cimg_set_key(DELETE); _cimg_set_key(END); _cimg_set_key(PAGEDOWN);
      _cimg_set_key(CAPSLOCK); _cimg_set_key(A); _cimg_set_key(S); _cimg_set_key(D);
      _cimg_set_key(F); _cimg_set_key(G); _cimg_set_key(H); _cimg_set_key(J);
      _cimg_set_key(K); _cimg_set_key(L); _cimg_set_key(ENTER);
      _cimg_set_key(SHIFTLEFT); _cimg_set_key(Z); _cimg_set_key(X); _cimg_set_key(C);
      _cimg_set_key(V); _cimg_set_key(B); _cimg_set_key(N); _cimg_set_key(M);
      _cimg_set_key(SHIFTRIGHT); _cimg_set_key(ARROWUP); _cimg_set_key(CTRLLEFT);
      _cimg_set_key(APPLEFT); _cimg_set_key(ALT); _cimg_set_key(SPACE); _cimg_set_key(ALTGR);
      _cimg_set_key(APPRIGHT); _cimg_set_key(MENU); _cimg_set_key(CTRLRIGHT);
      _cimg_set_key(ARROWLEFT); _cimg_set_key(ARROWDOWN); _cimg_set_key(ARROWRIGHT);
      _cimg_set_key(PAD0); _cimg_set_key(PAD1); _cimg_set_key(PAD2);
      _cimg_set_key(PAD3); _cimg_set_key(PAD4); _cimg_set_key(PAD5);
      _cimg_set_key(PAD6); _cimg_set_key(PAD7); _cimg_set_key(PAD8);
      _cimg_set_key(PAD9); _cimg_set_key(PADADD); _cimg_set_key(PADSUB);
      _cimg_set_key(PADMUL); _cimg_set_key(PADDIV);
      if (pressed) {
        if (*_keys)
          std::memmove((void*)(_keys+1),(void*)_keys,sizeof(_keys) - sizeof(unsigned int));
        *_keys = keycode;
        if (*_released_keys) {
          std::memmove((void*)(_released_keys+1),(void*)_released_keys,sizeof(_released_keys) - sizeof(unsigned int));
          *_released_keys = 0;
        }
      } else {
        if (*_keys) {
          std::memmove((void*)(_keys+1),(void*)_keys,sizeof(_keys) - sizeof(unsigned int));
          *_keys = 0;
        }
        if (*_released_keys)
          std::memmove((void*)(_released_keys+1),(void*)_released_keys,sizeof(_released_keys) - sizeof(unsigned int));
        *_released_keys = keycode;
      }
      _is_event = keycode?true:false;
      return *this;
    }